

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

char * server_extension_to_string(server_extension_type extension)

{
  char *pcStack_10;
  server_extension_type extension_local;
  
  if (extension == RANDR) {
    pcStack_10 = "RANDR";
  }
  else if (extension == XINERAMA) {
    pcStack_10 = "Xinerama";
  }
  else if (extension == NO_EXTENSION) {
    pcStack_10 = "X";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char *server_extension_to_string(enum server_extension_type extension)
{
        switch (extension) {
        case RANDR:
                return "RANDR";
        case XINERAMA:
                return "Xinerama";
        case NO_EXTENSION:
                return "X";
        default:
                return "";
        }
}